

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

ssize_t __thiscall
ddd::DaTrie<true,_false,_true>::write
          (DaTrie<true,_false,_true> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  char *pcVar2;
  long local_28;
  
  pcVar2 = (char *)CONCAT44(in_register_00000034,__fd);
  local_28 = (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  std::ostream::write(pcVar2,(long)&local_28);
  std::ostream::write(pcVar2,(long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
  local_28 = (long)(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  std::ostream::write(pcVar2,(long)&local_28);
  std::ostream::write(pcVar2,(long)(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
  local_28 = (long)(this->blocks_).
                   super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->blocks_).
                   super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                   super__Vector_impl_data._M_start >> 4;
  std::ostream::write(pcVar2,(long)&local_28);
  std::ostream::write(pcVar2,(long)(this->blocks_).
                                   super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
  local_28 = (long)(this->node_links_).
                   super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->node_links_).
                   super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1;
  std::ostream::write(pcVar2,(long)&local_28);
  std::ostream::write(pcVar2,(long)(this->node_links_).
                                   super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
  local_28._0_4_ = this->head_pos_;
  std::ostream::write(pcVar2,(long)&local_28);
  local_28._0_4_ = this->bc_emps_;
  std::ostream::write(pcVar2,(long)&local_28);
  local_28 = CONCAT44(local_28._4_4_,this->tail_emps_);
  sVar1 = std::ostream::write(pcVar2,(long)&local_28);
  return sVar1;
}

Assistant:

void write(std::ostream& os) const {
    utils::write_vector(bc_, os);
    utils::write_vector(tail_, os);
    utils::write_vector(blocks_, os);
    utils::write_vector(node_links_, os);
    utils::write_value(head_pos_, os);
    utils::write_value(bc_emps_, os);
    utils::write_value(tail_emps_, os);
  }